

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O2

string * __thiscall sjtu::exception::what_abi_cxx11_(string *__return_storage_ptr__,exception *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  std::operator+(&bStack_38,&this->variant," ");
  std::operator+(__return_storage_ptr__,&bStack_38,&this->detail);
  std::__cxx11::string::~string((string *)&bStack_38);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string what() {
		return variant + " " + detail;
	}